

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Reader.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::BP4Reader::DoGetSync(BP4Reader *this,Variable<int> *variable,int32_t *data)

{
  BP4Deserializer *this_00;
  pointer pBVar1;
  pointer pBVar2;
  int iVar3;
  BPInfo *blockInfo;
  pointer this_01;
  ScopedTimer __var2841;
  string local_90;
  string local_70;
  string local_50;
  
  if ((DoGetSync(adios2::core::Variable<int>&,int*)::__var841 == '\0') &&
     (iVar3 = __cxa_guard_acquire(&DoGetSync(adios2::core::Variable<int>&,int*)::__var841),
     iVar3 != 0)) {
    DoGetSync::__var841 = (void *)ps_timer_create_("BP4Reader::Get");
    __cxa_guard_release(&DoGetSync(adios2::core::Variable<int>&,int*)::__var841);
  }
  __var2841.m_timer = DoGetSync::__var841;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Engine","");
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"BP4Reader","");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"GetSync","");
  iVar3 = helper::Comm::Rank(&(this->super_Engine).m_Comm);
  helper::Log(&local_50,&local_70,&local_90,&(variable->super_VariableBase).m_Name,0,iVar3,5,
              this->m_Verbosity,INFO);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  this_00 = &this->m_BP4Deserializer;
  if ((variable->super_VariableBase).m_SingleValue == true) {
    adios2::format::BP4Deserializer::GetValueFromMetadata<int>(this_00,variable,data);
  }
  else {
    blockInfo = adios2::format::BP4Deserializer::InitVariableBlockInfo<int>(this_00,variable,data);
    adios2::format::BP4Deserializer::SetVariableBlockInfo<int>(this_00,variable,blockInfo);
    ReadVariableBlocks<int>(this,variable);
    pBVar1 = (variable->m_BlocksInfo).
             super__Vector_base<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pBVar2 = (variable->m_BlocksInfo).
             super__Vector_base<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this_01 = pBVar1;
    if (pBVar2 != pBVar1) {
      do {
        Variable<int>::BPInfo::~BPInfo(this_01);
        this_01 = this_01 + 1;
      } while (this_01 != pBVar2);
      (variable->m_BlocksInfo).
      super__Vector_base<adios2::core::Variable<int>::BPInfo,_std::allocator<adios2::core::Variable<int>::BPInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = pBVar1;
    }
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&__var2841);
  return;
}

Assistant:

void BP4Reader::DoClose(const int transportIndex)
{
    PERFSTUBS_SCOPED_TIMER("BP4Reader::Close");
    helper::Log("Engine", "BP4Reader", "Close", m_Name, 0, m_Comm.Rank(), 5, m_Verbosity,
                helper::LogMode::INFO);
    PerformGets();
    /* Remove all variables we created in the last step */
    RemoveCreatedVars();

    m_DataFileManager.CloseFiles();
    m_MDFileManager.CloseFiles();
    m_MDIndexFileManager.CloseFiles();
}